

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::FunctionalTest::CheckSecondFramebufferContent
          (FunctionalTest *this)

{
  GLubyte *pGVar1;
  GLubyte *pGVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  GLubyte (*paGVar6) [4];
  GLuint j;
  ulong uVar7;
  GLubyte (*paGVar8) [4];
  GLubyte framebuffer_values [3] [4];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar5 + 0x78))(0x8d40,this->m_fbo_2nd);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1e01);
  paGVar8 = framebuffer_values;
  framebuffer_values[2][0] = '\0';
  framebuffer_values[2][1] = '\0';
  framebuffer_values[2][2] = '\0';
  framebuffer_values[2][3] = '\0';
  framebuffer_values[0][0] = '\0';
  framebuffer_values[0][1] = '\0';
  framebuffer_values[0][2] = '\0';
  framebuffer_values[0][3] = '\0';
  framebuffer_values[1][0] = '\0';
  framebuffer_values[1][1] = '\0';
  framebuffer_values[1][2] = '\0';
  framebuffer_values[1][3] = '\0';
  (**(code **)(lVar5 + 0x1220))(0,0,4,3,0x1903,0x1401,paGVar8);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glReadPixels call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1e0a);
  paGVar6 = CheckSecondFramebufferContent::reference_values;
  for (uVar7 = 0; uVar7 != 3; uVar7 = uVar7 + 1) {
    lVar5 = 0;
    while (lVar5 != 4) {
      pGVar1 = *paGVar6 + lVar5;
      pGVar2 = *paGVar8 + lVar5;
      lVar5 = lVar5 + 1;
      if (*pGVar1 != *pGVar2) goto LAB_00b06d89;
    }
    paGVar6 = paGVar6 + 1;
    paGVar8 = paGVar8 + 1;
  }
LAB_00b06d89:
  return 2 < uVar7;
}

Assistant:

bool FunctionalTest::CheckSecondFramebufferContent()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_2nd);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	glw::GLubyte framebuffer_values[3][4] = {
		{ 0 } /* , ... */
	};

	static const glw::GLubyte reference_values[3][4] = { { 0, 0, 0, 0 }, { 0, 0, 255, 0 }, { 0, 0, 0, 0 } };

	gl.readPixels(0, 0, 4, 3, GL_RED, GL_UNSIGNED_BYTE, framebuffer_values);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");

	for (glw::GLuint j = 0; j < 3; ++j)
	{
		for (glw::GLuint i = 0; i < 4; ++i)
		{
			if (reference_values[j][i] != framebuffer_values[j][i])
			{
				return false;
			}
		}
	}

	return true;
}